

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O1

size_t __thiscall SigningCertificate::SetDataSize(SigningCertificate *this)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = GetDataSize<ESSCertID>(&this->certs);
  if (sVar1 == 0) {
    sVar1 = 2;
  }
  sVar2 = GetDataSize<PolicyInformation>(&this->policies);
  if (sVar2 == 0) {
    sVar2 = 2;
  }
  (this->super_DerBase).cbData = sVar2 + sVar1;
  return sVar2 + sVar1;
}

Assistant:

virtual size_t SetDataSize() override
	{
		return (cbData = GetEncodedSize(certs) + GetEncodedSize(policies));
	}